

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

String __thiscall doctest::detail::rawMemoryToString(detail *this,void *object,uint size)

{
  Arch AVar1;
  ostream *poVar2;
  char *in;
  string local_1e0 [36];
  int local_1bc;
  char local_1b5;
  ostringstream local_1a8 [8];
  ostringstream os;
  uchar *bytes;
  int inc;
  int end;
  int i;
  uint size_local;
  void *object_local;
  
  inc = 0;
  bytes._0_4_ = 1;
  AVar1 = Endianness::which();
  bytes._4_4_ = size;
  if (AVar1 == Little) {
    inc = size - 1;
    bytes._0_4_ = -1;
    bytes._4_4_ = 0xffffffff;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar2 = std::operator<<((ostream *)local_1a8,"0x");
  local_1b5 = (char)std::setfill<char>('0');
  poVar2 = std::operator<<(poVar2,local_1b5);
  std::ostream::operator<<(poVar2,std::hex);
  for (; inc != bytes._4_4_; inc = (int)bytes + inc) {
    local_1bc = (int)std::setw(2);
    poVar2 = std::operator<<((ostream *)local_1a8,(_Setw)local_1bc);
    std::ostream::operator<<(poVar2,(uint)*(byte *)((long)object + (long)inc));
  }
  std::__cxx11::ostringstream::str();
  in = (char *)std::__cxx11::string::c_str();
  String::String((String *)this,in);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return (String)(char *)this;
}

Assistant:

String rawMemoryToString(const void* object, unsigned size) {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>(size), inc = 1;
        if(Endianness::which() == Endianness::Little) {
            i   = end - 1;
            end = inc = -1;
        }

        unsigned char const* bytes = static_cast<unsigned char const*>(object);
        std::ostringstream   os;
        os << "0x" << std::setfill('0') << std::hex;
        for(; i != end; i += inc)
            os << std::setw(2) << static_cast<unsigned>(bytes[i]);
        return os.str().c_str();
    }